

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxpool.h
# Opt level: O2

void __thiscall cxxpool::thread_pool::worker(thread_pool *this)

{
  unique_lock<std::mutex> *this_00;
  priority_task *ppVar1;
  byte bVar2;
  undefined1 local_98 [8];
  priority_task task;
  unique_lock<std::mutex> task_lock;
  
  this_00 = (unique_lock<std::mutex> *)
            &task.order_.count_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  do {
    detail::priority_task::priority_task((priority_task *)local_98);
    std::unique_lock<std::mutex>::unique_lock(this_00,&this->task_mutex_);
    std::condition_variable::wait<cxxpool::thread_pool::worker()::_lambda()_1_>
              (&this->task_cond_var_,this_00,(anon_class_8_1_8991fb9c)this);
    ppVar1 = (this->tasks_).c.
             super__Vector_base<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
             ._M_impl.super__Vector_impl_data._M_start;
    bVar2 = ppVar1 == (this->tasks_).c.
                      super__Vector_base<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
                      ._M_impl.super__Vector_impl_data._M_finish & this->done_;
    if (bVar2 == 0) {
      detail::priority_task::operator=((priority_task *)local_98,ppVar1);
      std::
      priority_queue<cxxpool::detail::priority_task,_std::vector<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>,_std::less<cxxpool::detail::priority_task>_>
      ::pop(&this->tasks_);
    }
    std::unique_lock<std::mutex>::~unique_lock(this_00);
    if (bVar2 == 0) {
      std::function<void_()>::operator()((function<void_()> *)local_98);
    }
    detail::priority_task::~priority_task((priority_task *)local_98);
  } while (bVar2 == 0);
  return;
}

Assistant:

void worker() {
        for (;;) {
            cxxpool::detail::priority_task task;
            {
                std::unique_lock<std::mutex> task_lock(task_mutex_);
                task_cond_var_.wait(task_lock, [this]{
                    return !paused_ && (done_ || !tasks_.empty());
                });
                if (done_ && tasks_.empty())
                    break;
                task = tasks_.top();
                tasks_.pop();
            }
            task();
        }
    }